

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

void twin_messenger_do_work(TWIN_MESSENGER_HANDLE twin_msgr_handle)

{
  TWIN_MESSENGER_INSTANCE_conflict *twin_msgr;
  TWIN_MESSENGER_HANDLE twin_msgr_handle_local;
  
  if (twin_msgr_handle != (TWIN_MESSENGER_HANDLE)0x0) {
    if (twin_msgr_handle->state == TWIN_MESSENGER_STATE_STARTED) {
      singlylinkedlist_remove_if
                (twin_msgr_handle->pending_patches,send_pending_twin_patch,twin_msgr_handle);
      process_twin_subscription(twin_msgr_handle);
    }
    process_timeouts(twin_msgr_handle);
    amqp_messenger_do_work(twin_msgr_handle->amqp_msgr);
  }
  return;
}

Assistant:

void twin_messenger_do_work(TWIN_MESSENGER_HANDLE twin_msgr_handle)
{
    if (twin_msgr_handle != NULL)
    {
        TWIN_MESSENGER_INSTANCE* twin_msgr = (TWIN_MESSENGER_INSTANCE*)twin_msgr_handle;

        if (twin_msgr->state == TWIN_MESSENGER_STATE_STARTED)
        {
            (void)singlylinkedlist_remove_if(twin_msgr->pending_patches, send_pending_twin_patch, (const void*)twin_msgr);

            process_twin_subscription(twin_msgr);
        }

        process_timeouts(twin_msgr);

        amqp_messenger_do_work(twin_msgr->amqp_msgr);
    }
}